

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

bool __thiscall ImportedFuncWrapper::isByOrdinal(ImportedFuncWrapper *this)

{
  bool bVar1;
  uint32_t *ptr_1;
  uint64_t *ptr;
  void *p;
  ImportedFuncWrapper *this_local;
  
  ptr = (uint64_t *)getValuePtr(this,ORIG_FIRST_THUNK);
  if (ptr == (uint64_t *)0x0) {
    ptr = (uint64_t *)getValuePtr(this,FIRST_THUNK);
  }
  if (ptr != (uint64_t *)0x0) {
    bVar1 = ExeElementWrapper::isBit64((ExeElementWrapper *)this);
    if (bVar1) {
      if ((*ptr & 0x8000000000000000) != 0) {
        return true;
      }
    }
    else if ((*ptr & 0x80000000) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ImportedFuncWrapper::isByOrdinal()
{
    void *p = getValuePtr(ImportEntryWrapper::ORIG_FIRST_THUNK);
    if (!p) p = getValuePtr(ImportEntryWrapper::FIRST_THUNK);
    if (!p) return false;

    if (isBit64()) {
        uint64_t* ptr =  (uint64_t*) p;
        if ((*ptr) & ORDINAL_FLAG64) return true;

    } else {
        uint32_t* ptr =  (uint32_t*) p;
        if ((*ptr) & ORDINAL_FLAG32) return true;
    }
    return false;
}